

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 int64_to_float32_scalbn_aarch64(int64_t a,int scale,float_status *status)

{
  float32 fVar1;
  FloatParts p;
  FloatParts pa;
  float_status *status_local;
  int scale_local;
  int64_t a_local;
  
  p = int_to_float(a,scale,status);
  fVar1 = float32_round_pack_canonical(p,status);
  return fVar1;
}

Assistant:

float32 int64_to_float32_scalbn(int64_t a, int scale, float_status *status)
{
    FloatParts pa = int_to_float(a, scale, status);
    return float32_round_pack_canonical(pa, status);
}